

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O1

line_data_t *
kiste::parse_text_line(line_data_t *__return_storage_ptr__,parse_context *ctx,string *line)

{
  char c;
  size_t sVar1;
  parse_error *this;
  undefined1 local_58 [16];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  if (ctx->_class_curly_level < ctx->_curly_level) {
    local_58._0_8_ = (pointer)0x0;
    local_58._8_8_ = (pointer)0x0;
    local_48._M_p = (pointer)0x0;
    __return_storage_ptr__->_type = text;
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
              (&__return_storage_ptr__->_segments,
               (vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)local_58);
    (__return_storage_ptr__->_class_data)._name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_class_data)._name.field_2;
    (__return_storage_ptr__->_class_data)._name._M_string_length = 0;
    (__return_storage_ptr__->_class_data)._name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_class_data)._parent_name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_class_data)._parent_name.field_2;
    (__return_storage_ptr__->_class_data)._parent_name._M_string_length = 0;
    (__return_storage_ptr__->_class_data)._parent_name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_member).class_name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_member).class_name.field_2;
    (__return_storage_ptr__->_member).class_name._M_string_length = 0;
    (__return_storage_ptr__->_member).class_name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_member).name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_member).name.field_2;
    (__return_storage_ptr__->_member).name._M_string_length = 0;
    (__return_storage_ptr__->_member).name.field_2._M_local_buf[0] = '\0';
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::~vector
              ((vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)local_58);
    if (line->_M_string_length != 0) {
      sVar1 = 0;
      do {
        c = (line->_M_dataplus)._M_p[sVar1];
        if (c == '$') {
          parse_command((segment_t *)local_58,line,sVar1 + 1);
          sVar1 = line_data_t::add_segment(__return_storage_ptr__,(segment_t *)local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_p != &local_38) {
            operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
          }
        }
        else {
          line_data_t::add_character(__return_storage_ptr__,c);
        }
        sVar1 = sVar1 + 1;
      } while (sVar1 < line->_M_string_length);
    }
    return __return_storage_ptr__;
  }
  this = (parse_error *)__cxa_allocate_exception(0x10);
  parse_error::parse_error(this,"Unexpected text outside of member function");
  __cxa_throw(this,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto parse_text_line(const parse_context& ctx, const std::string& line) -> line_data_t
  {
    if (ctx._curly_level <= ctx._class_curly_level)
      throw parse_error("Unexpected text outside of member function");

    auto text_line = line_data_t{line_type::text, {}};
    for (std::size_t pos = 0; pos < line.size(); ++pos)
    {
      switch (line.at(pos))
      {
      case '$':
      {
        pos = text_line.add_segment(parse_command(line, ++pos));
        break;
      }
      default:
        text_line.add_character(line.at(pos));
        break;
      }
    }

    return text_line;
  }